

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeys_test.cpp
# Opt level: O0

void __thiscall jbcoin::tests::ValidatorKeys_test::testWriteToFile(ValidatorKeys_test *this)

{
  bool bVar1;
  string *psVar2;
  bool local_5e9 [9];
  runtime_error *e_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5c0;
  path local_5a0;
  undefined1 local_580 [8];
  path conflictingPath;
  path local_540;
  undefined1 local_520 [8];
  path keyFile_3;
  runtime_error *e;
  string error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> expectedError;
  path local_490;
  undefined1 local_470 [8];
  path badKeyFile;
  KeyFileGuard g_2;
  undefined1 local_420 [8];
  string subdir_2;
  undefined1 local_3f8 [8];
  ValidatorKeys fileKeys_1;
  undefined1 local_390 [8];
  KeyFileGuard g_1;
  path local_348;
  undefined1 local_328 [8];
  path keyFile_2;
  undefined1 local_300 [8];
  string subdir_1;
  path local_2c0;
  undefined1 local_2a0 [8];
  path keyFile_1;
  ValidatorKeys local_278;
  KeyType local_214;
  optional<jbcoin::ValidatorToken> local_210;
  bool local_1c1;
  undefined1 local_1c0 [8];
  ValidatorKeys fileKeys;
  undefined1 local_158 [8];
  KeyFileGuard g;
  path local_110;
  undefined1 local_f0 [8];
  path keyFile;
  undefined1 local_c8 [8];
  string subdir;
  ValidatorKeys keys;
  KeyType keyType;
  allocator local_31;
  string local_30;
  ValidatorKeys_test *local_10;
  ValidatorKeys_test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"Write to File",&local_31);
  beast::unit_test::suite::testcase_t::operator()
            (&(this->super_suite).testcase,&local_30,no_abort_on_fail);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  keys.tokenSequence_ = 1;
  ValidatorKeys::ValidatorKeys
            ((ValidatorKeys *)((long)&subdir.field_2 + 8),(KeyType *)&keys.tokenSequence_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_c8,"test_key_file",
             (allocator *)(keyFile.m_pathname.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator
            ((allocator<char> *)(keyFile.m_pathname.field_2._M_local_buf + 0xf));
  boost::filesystem::path::path(&local_110,(string_type *)local_c8);
  boost::filesystem::path::path((path *)&g.test_,"validator_keys.json");
  boost::filesystem::operator/((path *)local_f0,&local_110,(path *)&g.test_);
  boost::filesystem::path::~path((path *)&g.test_);
  boost::filesystem::path::~path(&local_110);
  KeyFileGuard::KeyFileGuard((KeyFileGuard *)local_158,&this->super_suite,(string *)local_c8);
  ValidatorKeys::writeToFile((ValidatorKeys *)((long)&subdir.field_2 + 8),(path *)local_f0);
  fileKeys._95_1_ = boost::filesystem::exists((path *)local_f0);
  beast::unit_test::suite::expect<bool>
            (&this->super_suite,(bool *)&fileKeys.field_0x5f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
             ,0x138);
  ValidatorKeys::make_ValidatorKeys((ValidatorKeys *)local_1c0,(path *)local_f0);
  local_1c1 = ValidatorKeys::operator==
                        ((ValidatorKeys *)((long)&subdir.field_2 + 8),(ValidatorKeys *)local_1c0);
  beast::unit_test::suite::expect<bool>
            (&this->super_suite,&local_1c1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
             ,0x13b);
  local_214 = secp256k1;
  ValidatorKeys::createValidatorToken
            (&local_210,(ValidatorKeys *)((long)&subdir.field_2 + 8),&local_214);
  boost::optional<jbcoin::ValidatorToken>::~optional(&local_210);
  ValidatorKeys::writeToFile((ValidatorKeys *)((long)&subdir.field_2 + 8),(path *)local_f0);
  ValidatorKeys::make_ValidatorKeys(&local_278,(path *)local_f0);
  ValidatorKeys::operator=((ValidatorKeys *)local_1c0,&local_278);
  ValidatorKeys::~ValidatorKeys(&local_278);
  keyFile_1.m_pathname.field_2._M_local_buf[0xf] =
       ValidatorKeys::operator==
                 ((ValidatorKeys *)((long)&subdir.field_2 + 8),(ValidatorKeys *)local_1c0);
  beast::unit_test::suite::expect<bool>
            (&this->super_suite,(bool *)(keyFile_1.m_pathname.field_2._M_local_buf + 0xf),
             "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
             ,0x142);
  ValidatorKeys::~ValidatorKeys((ValidatorKeys *)local_1c0);
  KeyFileGuard::~KeyFileGuard((KeyFileGuard *)local_158);
  boost::filesystem::path::~path((path *)local_f0);
  std::__cxx11::string::~string((string *)local_c8);
  boost::filesystem::path::path((path *)local_2a0,"test_validator_keys.json");
  bVar1 = boost::filesystem::exists((path *)local_2a0);
  if (!bVar1) {
    ValidatorKeys::writeToFile((ValidatorKeys *)((long)&subdir.field_2 + 8),(path *)local_2a0);
    psVar2 = boost::filesystem::path::string_abi_cxx11_((path *)local_2a0);
    boost::filesystem::path::path(&local_2c0,psVar2);
    boost::filesystem::remove((char *)&local_2c0);
    boost::filesystem::path::~path(&local_2c0);
    boost::filesystem::path::~path((path *)local_2a0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_300,"test_key_file",
               (allocator *)(keyFile_2.m_pathname.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator
              ((allocator<char> *)(keyFile_2.m_pathname.field_2._M_local_buf + 0xf));
    boost::filesystem::path::path(&local_348,(string_type *)local_300);
    boost::filesystem::path::path((path *)&g_1.test_,"directories/to/create/validator_keys.json");
    boost::filesystem::operator/((path *)local_328,&local_348,(path *)&g_1.test_);
    boost::filesystem::path::~path((path *)&g_1.test_);
    boost::filesystem::path::~path(&local_348);
    KeyFileGuard::KeyFileGuard((KeyFileGuard *)local_390,&this->super_suite,(string *)local_300);
    ValidatorKeys::writeToFile((ValidatorKeys *)((long)&subdir.field_2 + 8),(path *)local_328);
    fileKeys_1._95_1_ = boost::filesystem::exists((path *)local_328);
    beast::unit_test::suite::expect<bool>
              (&this->super_suite,(bool *)&fileKeys_1.field_0x5f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0x15c);
    ValidatorKeys::make_ValidatorKeys((ValidatorKeys *)local_3f8,(path *)local_328);
    subdir_2.field_2._M_local_buf[0xf] =
         ValidatorKeys::operator==
                   ((ValidatorKeys *)((long)&subdir.field_2 + 8),(ValidatorKeys *)local_3f8);
    beast::unit_test::suite::expect<bool>
              (&this->super_suite,(bool *)(subdir_2.field_2._M_local_buf + 0xf),
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0x15f);
    ValidatorKeys::~ValidatorKeys((ValidatorKeys *)local_3f8);
    KeyFileGuard::~KeyFileGuard((KeyFileGuard *)local_390);
    boost::filesystem::path::~path((path *)local_328);
    std::__cxx11::string::~string((string *)local_300);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_420,"test_key_file",(allocator *)((long)&g_2.test_ + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&g_2.test_ + 7));
    KeyFileGuard::KeyFileGuard
              ((KeyFileGuard *)((long)&badKeyFile.m_pathname.field_2 + 8),&this->super_suite,
               (string *)local_420);
    boost::filesystem::path::path(&local_490,(string_type *)local_420);
    boost::filesystem::path::path((path *)((long)&expectedError.field_2 + 8),".");
    boost::filesystem::operator/
              ((path *)local_470,&local_490,(path *)((long)&expectedError.field_2 + 8));
    boost::filesystem::path::~path((path *)((long)&expectedError.field_2 + 8));
    boost::filesystem::path::~path(&local_490);
    psVar2 = boost::filesystem::path::string_abi_cxx11_((path *)local_470);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&error.field_2 + 8),"Cannot open key file: ",psVar2);
    std::__cxx11::string::string((string *)&e);
    ValidatorKeys::writeToFile((ValidatorKeys *)((long)&subdir.field_2 + 8),(path *)local_470);
    keyFile_3.m_pathname.field_2._M_local_buf[0xf] =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&e,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (error.field_2._M_local_buf + 8));
    beast::unit_test::suite::expect<bool>
              (&this->super_suite,(bool *)(keyFile_3.m_pathname.field_2._M_local_buf + 0xf),
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0x16e);
    boost::filesystem::path::path(&local_540,(string_type *)local_420);
    boost::filesystem::path::path
              ((path *)((long)&conflictingPath.m_pathname.field_2 + 8),"validator_keys.json");
    boost::filesystem::operator/
              ((path *)local_520,&local_540,(path *)((long)&conflictingPath.m_pathname.field_2 + 8))
    ;
    boost::filesystem::path::~path((path *)((long)&conflictingPath.m_pathname.field_2 + 8));
    boost::filesystem::path::~path(&local_540);
    ValidatorKeys::writeToFile((ValidatorKeys *)((long)&subdir.field_2 + 8),(path *)local_520);
    boost::filesystem::path::path(&local_5a0,"validators_keys.json");
    boost::filesystem::operator/((path *)local_580,(path *)local_520,&local_5a0);
    boost::filesystem::path::~path(&local_5a0);
    boost::filesystem::path::parent_path();
    psVar2 = boost::filesystem::path::string_abi_cxx11_((path *)&e_1);
    std::operator+(&local_5c0,"Cannot create directory: ",psVar2);
    std::__cxx11::string::operator=((string *)(error.field_2._M_local_buf + 8),(string *)&local_5c0)
    ;
    std::__cxx11::string::~string((string *)&local_5c0);
    boost::filesystem::path::~path((path *)&e_1);
    ValidatorKeys::writeToFile((ValidatorKeys *)((long)&subdir.field_2 + 8),(path *)local_580);
    local_5e9[0] = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&e,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)(error.field_2._M_local_buf + 8));
    beast::unit_test::suite::expect<bool>
              (&this->super_suite,local_5e9,
               "/workspace/llm4binary/github/license_all_cmakelists_25/trongnmchainos[P]validator-keys-tool/src/test/ValidatorKeys_test.cpp"
               ,0x17c);
    boost::filesystem::path::~path((path *)local_580);
    boost::filesystem::path::~path((path *)local_520);
    std::__cxx11::string::~string((string *)&e);
    std::__cxx11::string::~string((string *)(error.field_2._M_local_buf + 8));
    boost::filesystem::path::~path((path *)local_470);
    KeyFileGuard::~KeyFileGuard((KeyFileGuard *)((long)&badKeyFile.m_pathname.field_2 + 8));
    std::__cxx11::string::~string((string *)local_420);
    ValidatorKeys::~ValidatorKeys((ValidatorKeys *)((long)&subdir.field_2 + 8));
    return;
  }
  psVar2 = boost::filesystem::path::string_abi_cxx11_((path *)local_2a0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&subdir_1.field_2 + 8),"Cannot create key file: ",psVar2);
  Throw<std::runtime_error,std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&subdir_1.field_2 + 8));
}

Assistant:

void
    testWriteToFile ()
    {
        testcase ("Write to File");

        using namespace boost::filesystem;

        auto const keyType = KeyType::ed25519;
        ValidatorKeys keys (keyType);

        {
            std::string const subdir = "test_key_file";
            path const keyFile = subdir / "validator_keys.json";
            KeyFileGuard g (*this, subdir);

            keys.writeToFile (keyFile);
            BEAST_EXPECT(exists (keyFile));

            auto fileKeys = ValidatorKeys::make_ValidatorKeys (keyFile);
            BEAST_EXPECT (keys == fileKeys);

            // Overwrite file with new sequence
            keys.createValidatorToken (KeyType::secp256k1);
            keys.writeToFile (keyFile);

            fileKeys = ValidatorKeys::make_ValidatorKeys (keyFile);
            BEAST_EXPECT (keys == fileKeys);
        }
        {
            // Write to key file in current relative directory
            path const keyFile = "test_validator_keys.json";
            if (!exists (keyFile))
            {
                keys.writeToFile (keyFile);
                remove (keyFile.string());
            }
            else
            {
                // Cannot run the test. Someone created a file
                // where we want to put our key file
                Throw<std::runtime_error> (
                    "Cannot create key file: " + keyFile.string ());
            }
        }
        {
            // Create key file directory
            std::string const subdir = "test_key_file";
            path const keyFile =
                subdir / "directories/to/create/validator_keys.json";
            KeyFileGuard g (*this, subdir);

            keys.writeToFile (keyFile);
            BEAST_EXPECT(exists (keyFile));

            auto const fileKeys = ValidatorKeys::make_ValidatorKeys (keyFile);
            BEAST_EXPECT (keys == fileKeys);
        }
        {
            // Fail if file cannot be opened for write
            std::string const subdir = "test_key_file";
            KeyFileGuard g (*this, subdir);

            path const badKeyFile = subdir / ".";
            auto expectedError = "Cannot open key file: " + badKeyFile.string();
            std::string error;
            try {
                keys.writeToFile (badKeyFile);
            } catch (std::runtime_error& e) {
                error = e.what();
            }
            BEAST_EXPECT(error == expectedError);

            // Fail if parent directory is existing file
            path const keyFile = subdir / "validator_keys.json";
            keys.writeToFile (keyFile);
            path const conflictingPath =
                keyFile / "validators_keys.json";
            expectedError = "Cannot create directory: " +
                conflictingPath.parent_path().string();
            try {
                keys.writeToFile (conflictingPath);
            } catch (std::runtime_error& e) {
                error = e.what();
            }
            BEAST_EXPECT(error == expectedError);
        }
    }